

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeTensorViewNV(ValidationState_t *_,Instruction *inst)

{
  ulong uVar1;
  Instruction *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  Op OVar5;
  uint id;
  DiagnosticStream *pDVar6;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar7;
  size_type sVar8;
  char *local_a30;
  DiagnosticStream local_a28;
  size_t local_850;
  uint64_t dim_value;
  DiagnosticStream local_840;
  string local_668;
  char *local_648;
  DiagnosticStream local_640;
  ulong local_468;
  uint64_t p_value;
  char *local_440;
  DiagnosticStream local_438;
  Instruction *local_260;
  Instruction *p;
  ulong uStack_250;
  uint p_id;
  size_t p_index;
  size_type num_dim;
  undefined1 local_238 [3];
  bool all_constant;
  uint32_t permutation_mask;
  char *local_218;
  DiagnosticStream local_210;
  Instruction *local_38;
  Instruction *has_dim;
  undefined4 local_28;
  uint has_dim_id;
  int has_dim_index;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _has_dim_index = inst;
  inst_local = (Instruction *)_;
  has_dim_id = ValidateTensorDim(_,inst);
  __local._4_4_ = has_dim_id;
  if (has_dim_id == SPV_SUCCESS) {
    local_28 = 2;
    has_dim._4_4_ = val::Instruction::GetOperandAs<unsigned_int>(_has_dim_index,2);
    local_38 = ValidationState_t::FindDef((ValidationState_t *)inst_local,has_dim._4_4_);
    pIVar2 = inst_local;
    if (local_38 != (Instruction *)0x0) {
      uVar4 = val::Instruction::type_id(local_38);
      bVar3 = ValidationState_t::IsBoolScalarType((ValidationState_t *)pIVar2,uVar4);
      if (bVar3) {
        num_dim._4_4_ = 0;
        num_dim._3_1_ = 1;
        pvVar7 = val::Instruction::operands(_has_dim_index);
        sVar8 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                          (pvVar7);
        p_index = sVar8 - 3;
        uStack_250 = 3;
        while( true ) {
          uVar1 = uStack_250;
          pvVar7 = val::Instruction::operands(_has_dim_index);
          sVar8 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                            (pvVar7);
          pIVar2 = inst_local;
          if (sVar8 <= uVar1) {
            if (((num_dim._3_1_ & 1) != 0) && (num_dim._4_4_ != (1 << ((byte)p_index & 0x1f)) - 1U))
            {
              ValidationState_t::diag
                        (&local_840,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                         _has_dim_index);
              OVar5 = val::Instruction::opcode(_has_dim_index);
              dim_value = (uint64_t)spvOpcodeString(OVar5);
              pDVar6 = DiagnosticStream::operator<<(&local_840,(char **)&dim_value);
              pDVar6 = DiagnosticStream::operator<<
                                 (pDVar6,(char (*) [52])
                                         " Permutation values don\'t form a valid permutation.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream(&local_840);
              return __local._4_4_;
            }
            id = val::Instruction::GetOperandAs<unsigned_int>(_has_dim_index,1);
            bVar3 = ValidationState_t::EvalConstantValUint64
                              ((ValidationState_t *)pIVar2,id,&local_850);
            if ((bVar3) && (local_850 != p_index)) {
              ValidationState_t::diag
                        (&local_a28,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                         _has_dim_index);
              OVar5 = val::Instruction::opcode(_has_dim_index);
              local_a30 = spvOpcodeString(OVar5);
              pDVar6 = DiagnosticStream::operator<<(&local_a28,&local_a30);
              pDVar6 = DiagnosticStream::operator<<
                                 (pDVar6,(char (*) [41])" Incorrect number of permutation values.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream(&local_a28);
              return __local._4_4_;
            }
            return SPV_SUCCESS;
          }
          p._4_4_ = val::Instruction::GetOperandAs<unsigned_int>(_has_dim_index,uStack_250);
          local_260 = ValidationState_t::FindDef((ValidationState_t *)inst_local,p._4_4_);
          pIVar2 = inst_local;
          if (local_260 == (Instruction *)0x0) break;
          uVar4 = val::Instruction::type_id(local_260);
          bVar3 = ValidationState_t::IsIntScalarType((ValidationState_t *)pIVar2,uVar4);
          pIVar2 = inst_local;
          if (!bVar3) break;
          uVar4 = val::Instruction::type_id(local_260);
          uVar4 = ValidationState_t::GetBitWidth((ValidationState_t *)pIVar2,uVar4);
          if (uVar4 != 0x20) break;
          bVar3 = ValidationState_t::EvalConstantValUint64
                            ((ValidationState_t *)inst_local,p._4_4_,&local_468);
          if (bVar3) {
            if (p_index <= local_468) {
              ValidationState_t::diag
                        (&local_640,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                         _has_dim_index);
              OVar5 = val::Instruction::opcode(_has_dim_index);
              local_648 = spvOpcodeString(OVar5);
              pDVar6 = DiagnosticStream::operator<<(&local_640,&local_648);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [19])" Permutation <id> ");
              ValidationState_t::getIdName_abi_cxx11_
                        (&local_668,(ValidationState_t *)inst_local,p._4_4_);
              pDVar6 = DiagnosticStream::operator<<(pDVar6,&local_668);
              pDVar6 = DiagnosticStream::operator<<
                                 (pDVar6,(char (*) [28])" must be a valid dimension.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              std::__cxx11::string::~string((string *)&local_668);
              DiagnosticStream::~DiagnosticStream(&local_640);
              return __local._4_4_;
            }
            num_dim._4_4_ = 1 << ((byte)local_468 & 0x1f) | num_dim._4_4_;
          }
          else {
            num_dim._3_1_ = 0;
          }
          uStack_250 = uStack_250 + 1;
        }
        ValidationState_t::diag
                  (&local_438,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_has_dim_index);
        OVar5 = val::Instruction::opcode(_has_dim_index);
        local_440 = spvOpcodeString(OVar5);
        pDVar6 = DiagnosticStream::operator<<(&local_438,&local_440);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [19])" Permutation <id> ");
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)&p_value,(ValidationState_t *)inst_local,p._4_4_);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&p_value);
        pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [26])" is not a 32-bit integer.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        std::__cxx11::string::~string((string *)&p_value);
        DiagnosticStream::~DiagnosticStream(&local_438);
        return __local._4_4_;
      }
    }
    ValidationState_t::diag
              (&local_210,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,_has_dim_index);
    OVar5 = val::Instruction::opcode(_has_dim_index);
    local_218 = spvOpcodeString(OVar5);
    pDVar6 = DiagnosticStream::operator<<(&local_210,&local_218);
    pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [21])" HasDimensions <id> ");
    ValidationState_t::getIdName_abi_cxx11_
              ((string *)local_238,(ValidationState_t *)inst_local,has_dim._4_4_);
    pDVar6 = DiagnosticStream::operator<<
                       (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_238);
    pDVar6 = DiagnosticStream::operator<<(pDVar6,(char (*) [25])" is not a boolean value.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    std::__cxx11::string::~string((string *)local_238);
    DiagnosticStream::~DiagnosticStream(&local_210);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTypeTensorViewNV(ValidationState_t& _,
                                      const Instruction* inst) {
  if (auto error = ValidateTensorDim(_, inst)) return error;

  const auto has_dim_index = 2;
  const auto has_dim_id = inst->GetOperandAs<uint32_t>(has_dim_index);
  const auto has_dim = _.FindDef(has_dim_id);
  if (!has_dim || !_.IsBoolScalarType(has_dim->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " HasDimensions <id> "
           << _.getIdName(has_dim_id) << " is not a boolean value.";
  }

  uint32_t permutation_mask = 0;
  bool all_constant = true;
  const auto num_dim = inst->operands().size() - 3;
  for (size_t p_index = 3; p_index < inst->operands().size(); ++p_index) {
    auto p_id = inst->GetOperandAs<uint32_t>(p_index);
    const auto p = _.FindDef(p_id);
    if (!p || !_.IsIntScalarType(p->type_id()) ||
        _.GetBitWidth(p->type_id()) != 32) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " Permutation <id> "
             << _.getIdName(p_id) << " is not a 32-bit integer.";
    }

    uint64_t p_value;
    if (_.EvalConstantValUint64(p_id, &p_value)) {
      if (p_value >= num_dim) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << spvOpcodeString(inst->opcode()) << " Permutation <id> "
               << _.getIdName(p_id) << " must be a valid dimension.";
      }
      permutation_mask |= 1 << p_value;
    } else {
      all_constant = false;
    }
  }
  if (all_constant && permutation_mask != (1U << num_dim) - 1U) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode())
           << " Permutation values don't form a valid permutation.";
  }

  uint64_t dim_value;
  if (_.EvalConstantValUint64(inst->GetOperandAs<uint32_t>(1), &dim_value)) {
    if (dim_value != num_dim) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode())
             << " Incorrect number of permutation values.";
    }
  }

  return SPV_SUCCESS;
}